

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_pool_init_fixed(nk_pool *pool,void *memory,nk_size size)

{
  nk_size in_RDX;
  void *in_RSI;
  long in_RDI;
  
  nk_zero(in_RSI,in_RDX);
  if (0x20f < in_RDX) {
    *(uint *)(in_RDI + 0x30) = ((int)in_RDX - 0x210U >> 9) + 1;
    *(void **)(in_RDI + 0x20) = in_RSI;
    *(undefined4 *)(in_RDI + 0x18) = 0;
    *(nk_size *)(in_RDI + 0x38) = in_RDX;
  }
  return;
}

Assistant:

NK_LIB void
nk_pool_init_fixed(struct nk_pool *pool, void *memory, nk_size size)
{
nk_zero(pool, sizeof(*pool));
NK_ASSERT(size >= sizeof(struct nk_page));
if (size < sizeof(struct nk_page)) return;
/* first nk_page_element is embedded in nk_page, additional elements follow in adjacent space */
pool->capacity = 1 + (unsigned)(size - sizeof(struct nk_page)) / sizeof(struct nk_page_element);
pool->pages = (struct nk_page*)memory;
pool->type = NK_BUFFER_FIXED;
pool->size = size;
}